

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

void cmSystemTools::ParseUnixCommandLine
               (char *command,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  char **ppcVar1;
  char *pcVar2;
  char **__args;
  cmSystemToolsArgV argv;
  cmSystemToolsArgV local_18;
  
  local_18.ArgV = cmsysSystem_Parse_CommandForUnix(command,0);
  if (local_18.ArgV != (char **)0x0) {
    pcVar2 = *local_18.ArgV;
    __args = local_18.ArgV;
    while (pcVar2 != (char *)0x0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,__args);
      ppcVar1 = __args + 1;
      __args = __args + 1;
      pcVar2 = *ppcVar1;
    }
  }
  cmSystemToolsArgV::~cmSystemToolsArgV(&local_18);
  return;
}

Assistant:

void cmSystemTools::ParseUnixCommandLine(const char* command,
                                         std::vector<std::string>& args)
{
  // Invoke the underlying parser.
  cmSystemToolsArgV argv(cmsysSystem_Parse_CommandForUnix(command, 0));
  argv.Store(args);
}